

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O2

int ffglkut(fitsfile *fptr,char *keyname,int firstchar,int maxvalchar,int maxcomchar,char *value,
           int *valuelen,char *comm,int *comlen,int *status)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  size_t sVar5;
  bool bVar6;
  char *local_160;
  char *local_158;
  int savedKeyPos;
  ulong local_148;
  size_t local_140;
  int keynum;
  int local_134;
  int local_130;
  uint local_12c;
  char comstring [73];
  char valstring [71];
  char card [81];
  
  keynum = 0;
  savedKeyPos = 1;
  iVar1 = *status;
  if (iVar1 < 1) {
    if (value != (char *)0x0) {
      *value = '\0';
    }
    if (comm != (char *)0x0) {
      *comm = '\0';
    }
    *valuelen = 0;
    *comlen = 0;
    card[0] = '\0';
    valstring[0] = '\0';
    comstring[0] = '\0';
    ffgcrd(fptr,keyname,card,status);
    iVar1 = *status;
    if (iVar1 < 1) {
      ffpsvc(card,valstring,comstring,status);
      iVar1 = *status;
      if (iVar1 < 1) {
        uVar4 = maxcomchar | maxvalchar;
        local_130 = maxcomchar;
        sVar2 = strlen(card);
        bVar6 = comstring[0] != '\0';
        local_134 = firstchar;
        local_12c = uVar4;
        if ((uVar4 == 0) && (ffghps(fptr,(int *)0x0,&savedKeyPos,status), 1 < savedKeyPos)) {
          savedKeyPos = savedKeyPos + -1;
        }
        if (valstring[0] == '\0') {
          local_160 = (char *)malloc(1);
          *local_160 = '\0';
          local_158 = (char *)malloc(1);
          *local_158 = '\0';
        }
        else {
          local_148 = CONCAT71(local_148._1_7_,sVar2 < 0x50 && bVar6);
          sVar2 = strlen(valstring);
          local_160 = (char *)malloc(sVar2 + 1);
          ffc2s(valstring,local_160,status);
          sVar2 = strlen(local_160);
          sVar3 = strlen(comstring);
          local_158 = (char *)malloc(sVar3 + 1);
          *local_158 = '\0';
          strcpy(local_158,comstring);
          sVar3 = strlen(local_158);
          while( true ) {
            bVar6 = false;
            do {
              sVar5 = sVar2;
              if ((bVar6) || (0 < *status)) goto LAB_001641c4;
              bVar6 = true;
              sVar2 = 0;
            } while (sVar5 == 0);
            if (local_160[sVar5 - 1] != '&') break;
            valstring[0] = '\0';
            comstring[0] = '\0';
            local_140 = sVar3;
            ffgcnt(fptr,valstring,comstring,status);
            if (comstring[0] == '\0' && valstring[0] == '\0') break;
            local_160[sVar5 - 1] = '\0';
            sVar2 = sVar5 - 1;
            if (valstring[0] != '\0') {
              sVar3 = strlen(valstring);
              sVar2 = sVar2 + sVar3;
              local_160 = (char *)realloc(local_160,sVar5 + sVar3);
              strcat(local_160,valstring);
            }
            if (comstring[0] != '\0') {
              sVar3 = strlen(comstring);
              if ((local_148 & 1) == 0) {
                local_148 = sVar3 + local_140;
                local_158 = (char *)realloc(local_158,sVar3 + local_140 + 1);
              }
              else {
                local_148 = local_140 + sVar3 + 1;
                local_158 = (char *)realloc(local_158,local_140 + sVar3 + 2);
                sVar3 = strlen(local_158);
                (local_158 + sVar3)[0] = ' ';
                (local_158 + sVar3)[1] = '\0';
              }
              local_140 = local_148;
              strcat(local_158,comstring);
            }
            ffghps(fptr,(int *)0x0,&keynum,status);
            ffgrec(fptr,keynum + -1,card,status);
            sVar3 = strlen(card);
            local_148 = CONCAT71(local_148._1_7_,local_140 != 0 && sVar3 < 0x50);
            sVar3 = local_140;
          }
        }
LAB_001641c4:
        sVar2 = strlen(local_160);
        sVar3 = strlen(local_158);
        *valuelen = (int)sVar2;
        *comlen = (int)sVar3;
        if (local_12c == 0) {
          ffmaky(fptr,savedKeyPos,status);
        }
        else {
          if ((value != (char *)0x0) && ((ulong)(long)local_134 <= sVar2)) {
            strncat(value,local_160 + ((long)local_134 - 1),(long)maxvalchar);
          }
          if (comm != (char *)0x0) {
            strncat(comm,local_158,(long)local_130);
          }
        }
        free(local_160);
        free(local_158);
        iVar1 = *status;
      }
    }
  }
  return iVar1;
}

Assistant:

int ffglkut( fitsfile *fptr,     /* I - FITS file pointer             */
           const char *keyname, /* I - name of keyword to read       */
           int firstchar,       /* I - first character of string to return */
           int maxvalchar,         /* I - maximum length of string to return */
	                        /*    (string will be null terminated)  */      
           int maxcomchar,      /* I - maximum length of comment to return */
           char *value,         /* O - pointer to keyword value (may be NULL) */
           int *valuelen,       /* O - total length of the keyword value string */
                                /*     The returned 'value' string may only */
				/*     contain a piece of the total string, depending */
				/*     on the value of firstchar and maxvalchar */
           char *comm,          /* O - keyword comment (may be NULL) */
           int *comlen,         /* O - total length of comment string */
           int  *status)        /* IO - error status                 */
{
    char valstring[FLEN_VALUE], comstring[FLEN_COMMENT], card[FLEN_CARD];
    char *dynValStr=0, *dynComStr=0;
    int contin, addCommDelim=0, keynum=0;
    int lenOnly=0, savedKeyPos=1;
    size_t len=0, lenc=0;

    if (*status > 0)
        return(*status);

    if (maxvalchar==0 && maxcomchar==0)
       lenOnly = 1;
    
    if (value)
       *value = '\0';
    if (comm)
       *comm = '\0';
    /* If lenOnly, 'value' and 'comm' should not be accessed after this point.*/
    
    *valuelen = 0; 
    *comlen = 0;   
    card[0] = '\0';
    valstring[0] = '\0';
    comstring[0] = '\0';
       
    ffgcrd(fptr, keyname, card, status);
    if (*status > 0)
       return(*status);
    ffpsvc(card,valstring, comstring, status);    
    if (*status > 0)
        return(*status);
    if (strlen(card) < FLEN_CARD-1 && *comstring)
       addCommDelim=1;
        
    /* If called in lenOnly mode, there's a good chance the user will soon call
       this again to read the value string.  Therefore we'll save and later restore
       the original keyword position. */
    if (lenOnly)
    {
       ffghps(fptr, 0, &savedKeyPos, status);
       if (savedKeyPos > 1)
          savedKeyPos -= 1;
    }

    if (!valstring[0])   /* null value string? */
    {
      dynValStr = (char *) malloc(1);  /* allocate and return a null string */
      *dynValStr = '\0';      
      dynComStr = (char *)malloc(1);
      *dynComStr= '\0';
    }
    else
    {
      /* allocate space,  plus 1 for null */
      dynValStr = (char *) malloc(strlen(valstring) + 1);

      ffc2s(valstring, dynValStr, status);   /* convert string to value */
      len = strlen(dynValStr);
      
      dynComStr = (char *) malloc(strlen(comstring)+1);
      dynComStr[0]=0;
      strcpy(dynComStr, comstring);
      lenc = strlen(dynComStr);

      /* If last character is a & then value may be continued on next keyword */
      contin = 1;
      while (contin && *status <= 0)  
      {
        if (len && *(dynValStr+len-1) == '&')  /*  is last char an ampersand?  */
        {
            valstring[0] = '\0';
            comstring[0] = '\0';
            ffgcnt(fptr, valstring, comstring, status);
            if (*valstring || *comstring)  /* If either valstring or comstring
                                  is filled, this must be a CONTINUE line */  
            {
               *(dynValStr+len-1) = '\0';         /* erase the trailing & char */
               len -= 1;
               if (*valstring)
               {
                  len += strlen(valstring);
                  dynValStr = (char *) realloc(dynValStr, len + 1); /* increase size */
                  strcat(dynValStr, valstring);     /* append the continued chars */
               }
               if (*comstring)
               {
                  /* concantenate comment strings */
                  if (addCommDelim)
                  {
                     lenc += strlen(comstring) + 1;
                     dynComStr = (char *) realloc(dynComStr, lenc + 1);
                     strcat(dynComStr, " ");
                     strcat(dynComStr, comstring);
                  }
                  else
                  {
                     lenc += strlen(comstring);
                     dynComStr = (char *) realloc(dynComStr, lenc + 1);
                     strcat(dynComStr, comstring);                     
                  }
               }
               /* Determine if a space delimiter is needed for next
                  comment concatenation (if any).  Assume it is if card length
                  of the most recently read keyword is less than max. 
                  keynum is 1-based. */
               ffghps(fptr,0,&keynum,status);
               ffgrec(fptr, keynum-1, card, status);
               addCommDelim = ((strlen(card) < FLEN_CARD-1) && lenc) ? 1 : 0;
            }
            else
	    {
                contin = 0;
            }
        }
        else
	{
            contin = 0;
	}
      }
    }
    
    /* Resetting len and lenc really shouldn't be necessary here, but
       just to make sure ... */
    len = strlen(dynValStr);
    lenc = strlen(dynComStr);
    *valuelen = len;
    *comlen = lenc;
    if (lenOnly)
       ffmaky(fptr, savedKeyPos, status);
    else
    {
       if (value)
       {
          if (firstchar <= len)
             strncat(value,dynValStr+firstchar-1,maxvalchar);
       }
       if (comm)
       {
          strncat(comm,dynComStr,maxcomchar);
       }
    }
    
    free(dynValStr);
    free(dynComStr);
        
    return(*status);
}